

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *this,size_type expected_max_items_in_table,Hasher *hf,Hasher *eql,SelectKey *ext,
                 SetKey *set,libc_allocator_with_realloc<std::pair<const_int,_int>_> *alloc)

{
  Hasher *in_RCX;
  long in_RSI;
  dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_RDI;
  SelectKey *in_R8;
  SetKey *in_R9;
  hasher *in_stack_ffffffffffffff78;
  ValInfo *in_stack_ffffffffffffff80;
  size_type local_60;
  size_type *min_buckets_wanted;
  size_type in_stack_ffffffffffffffb8;
  sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *in_stack_ffffffffffffffc0;
  
  Settings::Settings((Settings *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  KeyInfo::KeyInfo(&in_RDI->key_info,in_R8,in_R9,in_RCX);
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  min_buckets_wanted = &in_RDI->num_buckets;
  if (in_RSI == 0) {
    local_60 = 0x20;
  }
  else {
    local_60 = sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::
               min_buckets(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (size_type)min_buckets_wanted);
  }
  *min_buckets_wanted = local_60;
  alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::alloc_impl
            ((alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_> *)
             in_stack_ffffffffffffff80,
             (libc_allocator_with_realloc<std::pair<const_int,_int>_> *)in_stack_ffffffffffffff78);
  ValInfo::ValInfo(in_stack_ffffffffffffff80,
                   (alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_> *)
                   in_stack_ffffffffffffff78);
  alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::~alloc_impl
            ((alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_> *)
             0x10113cb);
  in_RDI->table = (pointer)0x0;
  bucket_count(in_RDI);
  sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *)in_RDI,
             (size_type)in_stack_ffffffffffffff78);
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        val_info(alloc_impl<value_alloc_type>(alloc)),
        table(NULL) {
    // table is NULL until emptyval is set.  However, we set num_buckets
    // here so we know how much space to allocate once emptyval is set
    settings.reset_thresholds(bucket_count());
  }